

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

void __thiscall NaPetriNet::NaPetriNet(NaPetriNet *this,char *szNetName)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  FILE *pFVar4;
  long in_RSI;
  NaPetriNet *in_RDI;
  char *szDigName;
  char *szEnvValue;
  char szEnvName [1024];
  int *in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  char local_428 [88];
  
  in_RDI->_vptr_NaPetriNet = (_func_int **)&PTR__NaPetriNet_00196440;
  NaInfoStand::NaInfoStand((NaInfoStand *)0x1575f0);
  NaDynAr<NaPetriNode_*>::NaDynAr(&in_RDI->pnaNet);
  in_RDI->pTimer = &TheTimer;
  in_RDI->bTimeChart = false;
  in_RDI->dfTimeChart = (NaDataFile *)0x0;
  in_RDI->pTimingNode = (NaPetriNode *)0x0;
  in_RDI->fpMap = (FILE *)0x0;
  in_RDI->fpDig = (FILE *)0x0;
  if (in_RSI == 0) {
    pcVar1 = autoname(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    in_RDI->szName = pcVar1;
  }
  else {
    pcVar1 = newstr(in_stack_fffffffffffffb60);
    in_RDI->szName = pcVar1;
  }
  sprintf(local_428,"%s_printout",in_RDI->szName);
  pcVar1 = getenv(local_428);
  if (pcVar1 == (char *)0x0) {
    in_RDI->bInitPrintout = false;
    in_RDI->bPrepPrintout = false;
    in_RDI->bStepPrintout = false;
    in_RDI->bTermPrintout = false;
    in_RDI->bMapPrintout = false;
    in_RDI->bDigPrintout = true;
  }
  else {
    pcVar1 = getenv(local_428);
    pcVar3 = strchr(pcVar1,0x69);
    in_RDI->bInitPrintout = pcVar3 != (char *)0x0;
    pcVar3 = strchr(pcVar1,0x70);
    in_RDI->bPrepPrintout = pcVar3 != (char *)0x0;
    pcVar3 = strchr(pcVar1,0x73);
    in_RDI->bStepPrintout = pcVar3 != (char *)0x0;
    pcVar3 = strchr(pcVar1,0x74);
    in_RDI->bTermPrintout = pcVar3 != (char *)0x0;
    pcVar3 = strchr(pcVar1,0x6d);
    in_RDI->bMapPrintout = pcVar3 != (char *)0x0;
    pcVar1 = strchr(pcVar1,0x67);
    in_RDI->bDigPrintout = pcVar1 != (char *)0x0;
  }
  if ((in_RDI->bDigPrintout & 1U) != 0) {
    pcVar1 = name(in_RDI);
    sVar2 = strlen(pcVar1);
    pcVar1 = (char *)operator_new__(sVar2 + 5);
    pcVar3 = name(in_RDI);
    sprintf(pcVar1,"%s.dot",pcVar3);
    pFVar4 = fopen(pcVar1,"wt");
    in_RDI->fpDig = (FILE *)pFVar4;
    if (in_RDI->fpDig == (FILE *)0x0) {
      NaPrintLog("Failed to write digraph output\n");
    }
    else {
      NaPrintLog("Digraph output will be put to \'%s\'\n",pcVar1);
    }
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
    }
    pFVar4 = (FILE *)in_RDI->fpDig;
    pcVar1 = name(in_RDI);
    fprintf(pFVar4,"digraph %s {\n  graph [ rankdir = LR ] ;\n  node [ shape = record ] ;\n\n",
            pcVar1);
  }
  return;
}

Assistant:

NaPetriNet::NaPetriNet (const char* szNetName)
{
    // Setup default timer
    pTimer = &TheTimer;
    bTimeChart = false;
    dfTimeChart = NULL;
    pTimingNode = NULL;

    fpMap = NULL;
    fpDig = NULL;

    if(NULL == szNetName)
        szName = autoname("pnet", iNetNumber);
    else
        szName = newstr(szNetName);


    /* setup verbose from program environment */
    char	szEnvName[1024];
    sprintf(szEnvName, "%s_printout", szName);
    if(NULL == getenv(szEnvName))
      {
	bInitPrintout = false;				// initialize(???)
	bPrepPrintout = false;				// prepare(???)
	bStepPrintout = false;				// step_alive(???)
	bTermPrintout = false;				// terminate(???)
	bMapPrintout = false;				// no activation map
	bDigPrintout = true;				// no digraph output
      }
    else
      {
	char	*szEnvValue = getenv(szEnvName);
	bInitPrintout = !!strchr(szEnvValue, 'i');	// initialize(true)
	bPrepPrintout = !!strchr(szEnvValue, 'p');	// prepare(true)
	bStepPrintout = !!strchr(szEnvValue, 's');	// step_alive(true)
	bTermPrintout = !!strchr(szEnvValue, 't');	// terminate(true)
	bMapPrintout = !!strchr(szEnvValue, 'm');	// print activation map
	bDigPrintout = !!strchr(szEnvValue, 'g');	// digraph output
      }

    if(bDigPrintout) {
	char	*szDigName = new char[strlen(name()) + sizeof(".dot")];
	sprintf(szDigName, "%s.dot", name());
	fpDig = fopen(szDigName, "wt");
	if(NULL == fpDig){
	    NaPrintLog("Failed to write digraph output\n");
	}else{
	    NaPrintLog("Digraph output will be put to '%s'\n", szDigName);
	}
	delete[] szDigName;

	fprintf(fpDig, "digraph %s {\n"\
		"  graph [ rankdir = LR ] ;\n"\
		"  node [ shape = record ] ;\n\n",
		name());
    }
}